

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

cio_error bs_write_ok(cio_buffered_stream *buffered_stream,cio_write_buffer *buf,
                     cio_buffered_stream_write_handler_t handler,void *handler_context)

{
  size_t sVar1;
  uint local_34;
  uint i;
  size_t len;
  void *handler_context_local;
  cio_buffered_stream_write_handler_t handler_local;
  cio_write_buffer *buf_local;
  cio_buffered_stream *buffered_stream_local;
  
  sVar1 = cio_write_buffer_get_num_buffer_elements(buf);
  handler_local = (cio_buffered_stream_write_handler_t)buf;
  for (local_34 = 0; local_34 < sVar1; local_34 = local_34 + 1) {
    handler_local = *(cio_buffered_stream_write_handler_t *)handler_local;
    memcpy(write_buffer + write_buffer_pos,*(void **)(handler_local + 0x10),
           *(size_t *)(handler_local + 0x18));
    write_buffer_pos = *(long *)(handler_local + 0x18) + write_buffer_pos;
  }
  (*handler)(buffered_stream,handler_context,CIO_SUCCESS);
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error bs_write_ok(struct cio_buffered_stream *buffered_stream, struct cio_write_buffer *buf, cio_buffered_stream_write_handler_t handler, void *handler_context)
{
	size_t len = cio_write_buffer_get_num_buffer_elements(buf);
	for (unsigned int i = 0; i < len; i++) {
		buf = buf->next;
		memcpy(&write_buffer[write_buffer_pos], buf->data.element.data, buf->data.element.length);
		write_buffer_pos += buf->data.element.length;
	}

	handler(buffered_stream, handler_context, CIO_SUCCESS);
	return CIO_SUCCESS;
}